

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

BufferSp __thiscall
vkt::SpirVAssembly::getSpecializedBuffer<long>(SpirVAssembly *this,deInt64 number)

{
  Buffer<long> *this_00;
  SharedPtrStateBase *extraout_RDX;
  BufferSp BVar1;
  allocator_type local_41;
  _Vector_base<long,_std::allocator<long>_> local_40;
  deInt64 local_28;
  
  this_00 = (Buffer<long> *)operator_new(0x20);
  local_28 = number;
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)&local_40,1,&local_28,&local_41);
  Buffer<long>::Buffer(this_00,(vector<long,_std::allocator<long>_> *)&local_40);
  de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
            ((SharedPtr<vkt::SpirVAssembly::BufferInterface> *)this,(BufferInterface *)this_00);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base(&local_40);
  BVar1.m_state = extraout_RDX;
  BVar1.m_ptr = (BufferInterface *)this;
  return BVar1;
}

Assistant:

BufferSp getSpecializedBuffer (deInt64 number)
{
	return BufferSp(new Buffer<T>(vector<T>(1, (T)number)));
}